

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O1

CollationCacheEntry * __thiscall
icu_63::CollationLoader::createCacheEntry(CollationLoader *this,UErrorCode *errorCode)

{
  uint uVar1;
  UBool UVar2;
  int iVar3;
  int iVar4;
  CollationCacheEntry *pCVar5;
  Locale *other;
  UResourceBundle *pUVar6;
  UChar *us;
  LocalPointerBase<UResourceBundle> resourceBundle;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  Locale *pLVar11;
  undefined1 auStack_1d8 [184];
  LocalUResourceBundlePointer LStack_120;
  int iStack_114;
  Locale LStack_110;
  
  if (this->bundle == (UResourceBundle *)0x0) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pLVar11 = &this->locale;
      pcVar10 = Locale::getBaseName(pLVar11);
      pUVar6 = ures_openNoDefault_63("icudt63l-coll",pcVar10,errorCode);
      this->bundle = pUVar6;
      if (*errorCode == U_MISSING_RESOURCE_ERROR) {
        *errorCode = U_USING_DEFAULT_WARNING;
        SharedObject::addRef(&this->rootEntry->super_SharedObject);
        pCVar5 = this->rootEntry;
      }
      else {
        Locale::Locale((Locale *)(LStack_110.script + 4),pLVar11);
        pcVar10 = ures_getLocaleByType_63(this->bundle,ULOC_ACTUAL_LOCALE,errorCode);
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          Locale::Locale((Locale *)auStack_1d8,pcVar10,(char *)0x0,(char *)0x0,(char *)0x0);
          other = Locale::operator=(&this->validLocale,(Locale *)auStack_1d8);
          Locale::operator=(pLVar11,other);
          Locale::~Locale((Locale *)auStack_1d8);
          if (this->type[0] != '\0') {
            Locale::setKeywordValue(pLVar11,"collation",this->type,errorCode);
          }
          UVar2 = Locale::operator==(pLVar11,(Locale *)(LStack_110.script + 4));
          if (UVar2 == '\0') {
            pCVar5 = getCacheEntry(this,errorCode);
          }
          else {
            pCVar5 = loadFromBundle(this,errorCode);
          }
        }
        else {
          pCVar5 = (CollationCacheEntry *)0x0;
        }
        Locale::~Locale((Locale *)(LStack_110.script + 4));
      }
    }
    else {
      pCVar5 = (CollationCacheEntry *)0x0;
    }
    return pCVar5;
  }
  if (this->collations == (UResourceBundle *)0x0) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pcVar10 = "collations";
      LStack_110.baseName = (char *)0x21e066;
      pUVar6 = ures_getByKey_63(this->bundle,"collations",(UResourceBundle *)0x0,errorCode);
      this->collations = pUVar6;
      if (*errorCode == U_MISSING_RESOURCE_ERROR) {
        *errorCode = U_USING_DEFAULT_WARNING;
        pCVar5 = makeCacheEntryFromRoot(this,(Locale *)pcVar10,errorCode);
        return pCVar5;
      }
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        LStack_110._220_4_ = 0;
        LStack_110.baseName = (char *)0x21e0b6;
        pUVar6 = ures_getByKeyWithFallback_63
                           (pUVar6,"default",(UResourceBundle *)0x0,
                            (UErrorCode *)&LStack_110.field_0xdc);
        LStack_110.baseName = (char *)0x21e0c9;
        us = ures_getString_63(pUVar6,(int32_t *)&LStack_110.fIsBogus,
                               (UErrorCode *)&LStack_110.field_0xdc);
        pcVar10 = this->defaultType;
        if (LStack_110._216_4_ - 1 < 0xf && (int)LStack_110._220_4_ < 1) {
          LStack_110.baseName = (char *)0x21e105;
          u_UCharsToChars_63(us,pcVar10,LStack_110._216_4_ + 1);
        }
        else {
          builtin_strncpy(pcVar10,"standard",9);
        }
        LStack_110.baseName = (char *)0x21e11b;
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                  ((LocalUResourceBundlePointer *)&stack0xffffffffffffffd0);
        pcVar8 = this->type;
        if (this->type[0] != '\0') {
          LStack_110.baseName = (char *)0x21e137;
          iVar3 = strcmp(pcVar8,pcVar10);
          if (iVar3 == 0) {
            *(byte *)&this->typesTried = (byte)this->typesTried | 2;
          }
          if (*(int *)(this->type + 3) == 0x686372 && *(int *)pcVar8 == 0x72616573) {
            *(byte *)&this->typesTried = (byte)this->typesTried | 1;
          }
          if (this->type[8] == '\0' && *(long *)pcVar8 == 0x647261646e617473) {
            *(byte *)&this->typesTried = (byte)this->typesTried | 4;
          }
          LStack_110.baseName = (char *)0x21e180;
          pCVar5 = loadFromCollations(this,errorCode);
          return pCVar5;
        }
        LStack_110.baseName = (char *)0x21e190;
        strcpy(pcVar8,pcVar10);
        uVar1 = this->typesTried;
        this->typesTried = uVar1 | 2;
        if (*(int *)(this->type + 3) == 0x686372 && *(int *)this->type == 0x72616573) {
          this->typesTried = uVar1 | 3;
        }
        if (this->type[8] == '\0' && *(long *)pcVar8 == 0x647261646e617473) {
          *(byte *)&this->typesTried = (byte)this->typesTried | 4;
        }
        LStack_110.baseName = (char *)0x21e1f7;
        Locale::setKeywordValue(&this->locale,"collation",pcVar8,errorCode);
        LStack_110.baseName = (char *)0x21e202;
        pCVar5 = getCacheEntry(this,errorCode);
        return pCVar5;
      }
    }
    return (CollationCacheEntry *)0x0;
  }
  if (this->data != (UResourceBundle *)0x0) {
    pCVar5 = loadFromData(this,errorCode);
    return pCVar5;
  }
  if (U_ZERO_ERROR < *errorCode) {
    return (CollationCacheEntry *)0x0;
  }
  pcVar10 = this->type;
  auStack_1d8[0xa8] = 'Z';
  auStack_1d8[0xa9] = -0x1e;
  auStack_1d8[0xaa] = '!';
  auStack_1d8[0xab] = '\0';
  auStack_1d8[0xac] = '\0';
  auStack_1d8[0xad] = '\0';
  auStack_1d8[0xae] = '\0';
  auStack_1d8[0xaf] = '\0';
  pLVar11 = (Locale *)pcVar10;
  resourceBundle.ptr =
       ures_getByKeyWithFallback_63(this->collations,pcVar10,(UResourceBundle *)0x0,errorCode);
  LStack_120.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)(LocalPointerBase<UResourceBundle>)resourceBundle.ptr;
  if (*errorCode == U_MISSING_RESOURCE_ERROR) {
    auStack_1d8[0xa8] = 'n';
    auStack_1d8[0xa9] = -0x1e;
    auStack_1d8[0xaa] = '!';
    auStack_1d8[0xab] = '\0';
    auStack_1d8[0xac] = '\0';
    auStack_1d8[0xad] = '\0';
    auStack_1d8[0xae] = '\0';
    auStack_1d8[0xaf] = '\0';
    sVar7 = strlen(pcVar10);
    *errorCode = U_USING_DEFAULT_WARNING;
    this->typeFallback = '\x01';
    uVar1 = this->typesTried;
    if ((((uVar1 & 1) == 0) && (6 < (int)sVar7)) &&
       (*(short *)(this->type + 4) == 0x6863 && *(int *)pcVar10 == 0x72616573)) {
      this->typesTried = uVar1 | 1;
      this->type[6] = '\0';
    }
    else if ((uVar1 & 2) == 0) {
      this->typesTried = uVar1 | 2;
      auStack_1d8[0xa8] = -0x3e;
      auStack_1d8[0xa9] = -0x1e;
      auStack_1d8[0xaa] = '!';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      strcpy(pcVar10,this->defaultType);
    }
    else {
      if ((uVar1 & 4) != 0) {
        auStack_1d8[0xa8] = ' ';
        auStack_1d8[0xa9] = -0x1d;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        pCVar5 = makeCacheEntryFromRoot(this,pLVar11,errorCode);
        goto LAB_0021e35b;
      }
      this->typesTried = uVar1 | 4;
      builtin_strncpy(pcVar10,"standard",9);
    }
    auStack_1d8[0xa8] = 'M';
    auStack_1d8[0xa9] = -0x1d;
    auStack_1d8[0xaa] = '!';
    auStack_1d8[0xab] = '\0';
    auStack_1d8[0xac] = '\0';
    auStack_1d8[0xad] = '\0';
    auStack_1d8[0xae] = '\0';
    auStack_1d8[0xaf] = '\0';
    Locale::setKeywordValue(&this->locale,"collation",pcVar10,errorCode);
    auStack_1d8[0xa8] = 'X';
    auStack_1d8[0xa9] = -0x1d;
    auStack_1d8[0xaa] = '!';
    auStack_1d8[0xab] = '\0';
    auStack_1d8[0xac] = '\0';
    auStack_1d8[0xad] = '\0';
    auStack_1d8[0xae] = '\0';
    auStack_1d8[0xaf] = '\0';
    pCVar5 = getCacheEntry(this,errorCode);
    goto LAB_0021e35b;
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    LStack_120.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)(UResourceBundle *)0x0;
    this->data = resourceBundle.ptr;
    auStack_1d8[0xa8] = -0x1b;
    auStack_1d8[0xa9] = -0x1e;
    auStack_1d8[0xaa] = '!';
    auStack_1d8[0xab] = '\0';
    auStack_1d8[0xac] = '\0';
    auStack_1d8[0xad] = '\0';
    auStack_1d8[0xae] = '\0';
    auStack_1d8[0xaf] = '\0';
    pcVar8 = ures_getLocaleByType_63(resourceBundle.ptr,ULOC_ACTUAL_LOCALE,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pLVar11 = &this->validLocale;
      auStack_1d8[0xa8] = -0x77;
      auStack_1d8[0xa9] = -0x1d;
      auStack_1d8[0xaa] = '!';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      pcVar9 = Locale::getBaseName(pLVar11);
      auStack_1d8[0xa8] = -0x6c;
      auStack_1d8[0xa9] = -0x1d;
      auStack_1d8[0xaa] = '!';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      iVar3 = strcmp(pcVar8,pcVar9);
      pcVar9 = this->defaultType;
      auStack_1d8[0xa8] = -0x5b;
      auStack_1d8[0xa9] = -0x1d;
      auStack_1d8[0xaa] = '!';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      iVar4 = strcmp(pcVar10,pcVar9);
      if (iVar4 != 0) {
        pcVar9 = "collation";
        auStack_1d8[0xa8] = -0x42;
        auStack_1d8[0xa9] = -0x1d;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        Locale::setKeywordValue(pLVar11,"collation",pcVar10,errorCode);
        if (U_ZERO_ERROR < *errorCode) goto LAB_0021e2ee;
      }
      if (*pcVar8 == '\0') {
LAB_0021e3e1:
        if (this->type[8] == '\0' && *(long *)pcVar10 == 0x647261646e617473) {
          if (this->typeFallback != '\0') {
            *errorCode = U_USING_DEFAULT_WARNING;
          }
          auStack_1d8[0xa8] = -0x68;
          auStack_1d8[0xa9] = -0x1c;
          auStack_1d8[0xaa] = '!';
          auStack_1d8[0xab] = '\0';
          auStack_1d8[0xac] = '\0';
          auStack_1d8[0xad] = '\0';
          auStack_1d8[0xae] = '\0';
          auStack_1d8[0xaf] = '\0';
          pCVar5 = makeCacheEntryFromRoot(this,(Locale *)pcVar9,errorCode);
          goto LAB_0021e35b;
        }
      }
      else {
        pcVar9 = "root";
        auStack_1d8[0xa8] = -0x23;
        auStack_1d8[0xa9] = -0x1d;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        iVar4 = strcmp(pcVar8,"root");
        if (iVar4 == 0) goto LAB_0021e3e1;
      }
      auStack_1d8[0xa8] = '\x14';
      auStack_1d8[0xa9] = -0x1c;
      auStack_1d8[0xaa] = '!';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      iStack_114 = iVar3;
      Locale::Locale(&LStack_110,pcVar8,(char *)0x0,(char *)0x0,(char *)0x0);
      auStack_1d8[0xa8] = '+';
      auStack_1d8[0xa9] = -0x1c;
      auStack_1d8[0xaa] = '!';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      Locale::operator=(&this->locale,&LStack_110);
      auStack_1d8[0xa8] = '3';
      auStack_1d8[0xa9] = -0x1c;
      auStack_1d8[0xaa] = '!';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      Locale::~Locale(&LStack_110);
      if (iStack_114 == 0) {
        auStack_1d8[0xa8] = 'x';
        auStack_1d8[0xa9] = -0x1c;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        pCVar5 = loadFromData(this,errorCode);
      }
      else {
        auStack_1d8[0xa8] = 'O';
        auStack_1d8[0xa9] = -0x1c;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        Locale::setKeywordValue(&this->locale,"collation",pcVar10,errorCode);
        auStack_1d8[0xa8] = 'Z';
        auStack_1d8[0xa9] = -0x1c;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        pCVar5 = getCacheEntry(this,errorCode);
        auStack_1d8[0xa8] = 'h';
        auStack_1d8[0xa9] = -0x1c;
        auStack_1d8[0xaa] = '!';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        pCVar5 = makeCacheEntry(pLVar11,pCVar5,errorCode);
      }
      goto LAB_0021e35b;
    }
  }
LAB_0021e2ee:
  pCVar5 = (CollationCacheEntry *)0x0;
LAB_0021e35b:
  auStack_1d8[0xa8] = 'e';
  auStack_1d8[0xa9] = -0x1d;
  auStack_1d8[0xaa] = '!';
  auStack_1d8[0xab] = '\0';
  auStack_1d8[0xac] = '\0';
  auStack_1d8[0xad] = '\0';
  auStack_1d8[0xae] = '\0';
  auStack_1d8[0xaf] = '\0';
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&LStack_120);
  return pCVar5;
}

Assistant:

const CollationCacheEntry *
CollationLoader::createCacheEntry(UErrorCode &errorCode) {
    // This is a linear lookup and fallback flow turned into a state machine.
    // Most local variables have been turned into instance fields.
    // In a cache miss, cache.get() calls CacheKey::createObject(),
    // which means that we progress via recursion.
    // loadFromCollations() will recurse to itself as well for collation type fallback.
    if(bundle == NULL) {
        return loadFromLocale(errorCode);
    } else if(collations == NULL) {
        return loadFromBundle(errorCode);
    } else if(data == NULL) {
        return loadFromCollations(errorCode);
    } else {
        return loadFromData(errorCode);
    }
}